

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O3

void __thiscall FIX::HttpServer::onStart(HttpServer *this)

{
  bool bVar1;
  int __fd;
  HttpServer *in_RSI;
  SocketServer *pSVar2;
  
  do {
    __fd = (int)in_RSI;
    pSVar2 = this->m_pServer;
    if (this->m_stop != false) goto LAB_00185a3c;
    if (pSVar2 == (SocketServer *)0x0) {
      return;
    }
    in_RSI = this;
    bVar1 = SocketServer::block(pSVar2,&this->super_Strategy,false,0.0);
    __fd = (int)in_RSI;
  } while (bVar1);
  pSVar2 = this->m_pServer;
LAB_00185a3c:
  if (pSVar2 != (SocketServer *)0x0) {
    SocketServer::close(pSVar2,__fd);
    pSVar2 = this->m_pServer;
    if (pSVar2 != (SocketServer *)0x0) {
      SocketMonitor::~SocketMonitor(&pSVar2->m_monitor);
      std::
      _Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
      ::~_Rb_tree(&(pSVar2->m_portToInfo)._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
                   *)pSVar2);
    }
    operator_delete(pSVar2,0x160);
    this->m_pServer = (SocketServer *)0x0;
  }
  return;
}

Assistant:

void HttpServer::onStart() {
  while (!m_stop && m_pServer && m_pServer->block(*this)) {}

  if (!m_pServer) {
    return;
  }

  m_pServer->close();
  delete m_pServer;
  m_pServer = 0;
}